

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  uint uVar1;
  LogMessage *other;
  ulong uVar3;
  size_t __n;
  LogFinisher local_51;
  LogMessage local_50;
  ulong uVar2;
  
  uVar2 = str->_M_string_length;
  if (uVar2 >> 0x20 != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x319);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (str.size()) <= (kuint32max): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    uVar2 = str->_M_string_length;
  }
  if ((uint)uVar2 < 0x80) {
    uVar2 = uVar2 & 0xffffffff;
  }
  else {
    uVar3 = uVar2 & 0xffffffff;
    do {
      uVar1 = (uint)uVar2;
      *target = (byte)uVar2 | 0x80;
      uVar2 = uVar3 >> 7;
      target = target + 1;
      uVar3 = uVar2;
    } while (0x3fff < uVar1);
  }
  *target = (byte)uVar2;
  __n = (size_t)(int)str->_M_string_length;
  memcpy(target + 1,(str->_M_dataplus)._M_p,__n);
  return target + __n + 1;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}